

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void new_localvar(LexState *ls,TString *name)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  FuncState *fs_00;
  Dyndata *pDVar4;
  GCObject *o;
  GCObject *pGVar5;
  long lVar6;
  Vardesc *pVVar7;
  FuncState *fs;
  undefined8 *puVar8;
  
  fs_00 = ls->fs;
  pDVar4 = ls->dyd;
  o = (GCObject *)fs_00->f;
  iVar2 = (o->p).sizelocvars;
  if (iVar2 <= fs_00->nlocvars) {
    pGVar5 = (GCObject *)
             luaM_growaux_(ls->L,(o->h).gclist,&(o->p).sizelocvars,0x10,0x7fff,"local variables");
    (o->h).gclist = pGVar5;
  }
  iVar3 = (o->p).sizelocvars;
  if (iVar2 < iVar3) {
    lVar6 = (long)iVar3 - (long)iVar2;
    puVar8 = (undefined8 *)((long)iVar2 * 0x10 + (long)(o->h).gclist);
    do {
      *puVar8 = 0;
      puVar8 = puVar8 + 2;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  *(TString **)((long)(o->h).gclist + (long)fs_00->nlocvars * 0x10) = name;
  if ((((name->tsv).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
    luaC_barrier_(ls->L,o,(GCObject *)name);
  }
  uVar1 = fs_00->nlocvars;
  fs_00->nlocvars = uVar1 + 1;
  iVar2 = (pDVar4->actvar).n;
  if ((iVar2 - fs_00->firstlocal) + 1 < 0xc9) {
    if ((pDVar4->actvar).size < iVar2 + 2) {
      pVVar7 = (Vardesc *)
               luaM_growaux_(ls->L,(pDVar4->actvar).arr,&(pDVar4->actvar).size,2,0x7ffffffd,
                             "local variables");
      (pDVar4->actvar).arr = pVVar7;
    }
    iVar2 = (pDVar4->actvar).n;
    (pDVar4->actvar).n = iVar2 + 1;
    (pDVar4->actvar).arr[iVar2].idx = uVar1;
    return;
  }
  errorlimit(fs_00,200,"local variables");
}

Assistant:

static void new_localvar (LexState *ls, TString *name) {
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  int reg = registerlocalvar(ls, name);
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                  MAXVARS, "local variables");
  luaM_growvector(ls->L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, MAX_INT, "local variables");
  dyd->actvar.arr[dyd->actvar.n++].idx = cast(short, reg);
}